

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_response::build_resp_str(coro_http_response *this,string *resp_str)

{
  status_type sVar1;
  char (*buf) [32];
  ulong in_RAX;
  size_type sVar2;
  long lVar3;
  ulong __n;
  unsigned_long __value;
  char *pcVar4;
  char *in_R8;
  long *in_FS_OFFSET;
  string_view sVar5;
  __integer_to_chars_result_type<unsigned_long> _Var6;
  bool has_host;
  bool has_len;
  undefined8 uStack_38;
  cinatra *this_00;
  
  sVar1 = this->status_;
  sVar2 = 0x22;
  if ((int)sVar1 < 400) {
    switch(sVar1) {
    case ok:
      pcVar4 = "HTTP/1.1 200 OK\r\n";
      sVar2 = 0x11;
      break;
    case created:
      pcVar4 = "HTTP/1.1 201 Created\r\n";
      sVar2 = 0x16;
      break;
    case accepted:
      pcVar4 = "HTTP/1.1 202 Accepted\r\n";
      goto LAB_0012a596;
    case nonauthoritative:
    case reset_content:
      goto switchD_0012a493_caseD_12f;
    case no_content:
      pcVar4 = "HTTP/1.1 204 No Content\r\n";
      sVar2 = 0x19;
      break;
    case partial_content:
      pcVar4 = "HTTP/1.1 206 Partial Content\r\n";
      goto LAB_0012a565;
    default:
      switch(sVar1) {
      case multiple_choices:
        pcVar4 = "HTTP/1.1 300 Multiple Choices\r\n";
        sVar2 = 0x1f;
        break;
      case moved_permanently:
        pcVar4 = "HTTP/1.1 301 Moved Permanently\r\n";
        goto LAB_0012a5c4;
      case moved_temporarily:
        pcVar4 = "HTTP/1.1 302 Moved Temporarily\r\n";
LAB_0012a5c4:
        sVar2 = 0x20;
        break;
      case 0x12f:
      case use_proxy:
      case 0x132:
        goto switchD_0012a493_caseD_12f;
      case not_modified:
        pcVar4 = "HTTP/1.1 304 Not Modified\r\n";
        goto LAB_0012a5d2;
      case temporary_redirect:
        pcVar4 = "HTTP/1.1 307 Temporary Redirect\r\n";
        goto LAB_0012a5e0;
      default:
        if (sVar1 != switching_protocols) goto switchD_0012a493_caseD_12f;
        pcVar4 = "HTTP/1.1 101 Switching Protocals\r\n";
      }
    }
    goto LAB_0012a5fc;
  }
  switch(sVar1) {
  case bad_request:
    pcVar4 = "HTTP/1.1 400 Bad Request\r\n";
LAB_0012a5ee:
    sVar2 = 0x1a;
    break;
  case unauthorized:
    pcVar4 = "HTTP/1.1 401 Unauthorized\r\n";
LAB_0012a5d2:
    sVar2 = 0x1b;
    break;
  case payment_required:
  case not_acceptable:
  case proxy_authentication_required:
  case request_timeout:
  case gone:
  case length_required:
  case precondition_failed:
  case request_entity_too_large:
  case request_uri_too_long:
  case unsupported_media_type:
switchD_0012a493_caseD_12f:
    pcVar4 = "HTTP/1.1 501 Not Implemented\r\n";
LAB_0012a565:
    sVar2 = 0x1e;
    break;
  case forbidden:
    pcVar4 = "HTTP/1.1 403 Forbidden\r\n";
    goto LAB_0012a588;
  case not_found:
    pcVar4 = "HTTP/1.1 404 Not Found\r\n";
LAB_0012a588:
    sVar2 = 0x18;
    break;
  case method_not_allowed:
    pcVar4 = "HTTP/1.1 405 Method Not Allowed\r\n";
LAB_0012a5e0:
    sVar2 = 0x21;
    break;
  case conflict:
    pcVar4 = "HTTP/1.1 409 Conflict\r\n";
LAB_0012a596:
    sVar2 = 0x17;
    break;
  case range_not_satisfiable:
    pcVar4 = "HTTP/1.1 416 Requested Range Not Satisfiable\r\n";
    sVar2 = 0x2e;
    break;
  default:
    switch(sVar1) {
    case internal_server_error:
      pcVar4 = "HTTP/1.1 500 Internal Server Error\r\n";
      sVar2 = 0x24;
      break;
    default:
      goto switchD_0012a493_caseD_12f;
    case bad_gateway:
      pcVar4 = "HTTP/1.1 502 Bad Gateway\r\n";
      goto LAB_0012a5ee;
    case service_unavailable:
      pcVar4 = "HTTP/1.1 503 Service Unavailable\r\n";
    }
  }
LAB_0012a5fc:
  uStack_38 = in_RAX;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (resp_str,pcVar4,sVar2);
  uStack_38 = uStack_38 & 0xffffffffffff;
  check_header<std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (this,&this->resp_headers_,(bool *)((long)&uStack_38 + 7),(bool *)((long)&uStack_38 + 6)
            );
  if ((this->resp_header_span_)._M_extent._M_extent_value != 0) {
    check_header<std::span<cinatra::http_header,18446744073709551615ul>>
              (this,&this->resp_header_span_,(bool *)((long)&uStack_38 + 7),
               (bool *)((long)&uStack_38 + 6));
  }
  if (uStack_38._6_1_ == '\0') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,"Server: cinatra\r\n",0x11);
  }
  if ((((this->content_)._M_string_length != 0) || (this->has_set_content_ != false)) ||
     (this->fmt_type_ == chunked)) goto LAB_0012a83e;
  sVar1 = this->status_;
  lVar3 = 0x22;
  if ((int)sVar1 < 400) {
    switch(sVar1) {
    case ok:
      pcVar4 = "HTTP/1.1 200 OK\r\n";
      lVar3 = 0x11;
      break;
    case created:
      pcVar4 = "HTTP/1.1 201 Created\r\n";
      lVar3 = 0x16;
      break;
    case accepted:
      pcVar4 = "HTTP/1.1 202 Accepted\r\n";
      goto LAB_0012a7c0;
    case nonauthoritative:
    case reset_content:
      goto switchD_0012a6bd_caseD_12f;
    case no_content:
      pcVar4 = "HTTP/1.1 204 No Content\r\n";
      lVar3 = 0x19;
      break;
    case partial_content:
      pcVar4 = "HTTP/1.1 206 Partial Content\r\n";
      goto LAB_0012a78f;
    default:
      switch(sVar1) {
      case multiple_choices:
        pcVar4 = "HTTP/1.1 300 Multiple Choices\r\n";
        lVar3 = 0x1f;
        break;
      case moved_permanently:
        pcVar4 = "HTTP/1.1 301 Moved Permanently\r\n";
        goto LAB_0012a7ee;
      case moved_temporarily:
        pcVar4 = "HTTP/1.1 302 Moved Temporarily\r\n";
LAB_0012a7ee:
        lVar3 = 0x20;
        break;
      case 0x12f:
      case use_proxy:
      case 0x132:
        goto switchD_0012a6bd_caseD_12f;
      case not_modified:
        pcVar4 = "HTTP/1.1 304 Not Modified\r\n";
        goto LAB_0012a7fc;
      case temporary_redirect:
        pcVar4 = "HTTP/1.1 307 Temporary Redirect\r\n";
        goto LAB_0012a80a;
      default:
        if (sVar1 != switching_protocols) goto switchD_0012a6bd_caseD_12f;
        pcVar4 = "HTTP/1.1 101 Switching Protocals\r\n";
      }
    }
    goto LAB_0012a826;
  }
  switch(sVar1) {
  case bad_request:
    pcVar4 = "HTTP/1.1 400 Bad Request\r\n";
LAB_0012a818:
    lVar3 = 0x1a;
    break;
  case unauthorized:
    pcVar4 = "HTTP/1.1 401 Unauthorized\r\n";
LAB_0012a7fc:
    lVar3 = 0x1b;
    break;
  case payment_required:
  case not_acceptable:
  case proxy_authentication_required:
  case request_timeout:
  case gone:
  case length_required:
  case precondition_failed:
  case request_entity_too_large:
  case request_uri_too_long:
  case unsupported_media_type:
switchD_0012a6bd_caseD_12f:
    pcVar4 = "HTTP/1.1 501 Not Implemented\r\n";
LAB_0012a78f:
    lVar3 = 0x1e;
    break;
  case forbidden:
    pcVar4 = "HTTP/1.1 403 Forbidden\r\n";
    goto LAB_0012a7b2;
  case not_found:
    pcVar4 = "HTTP/1.1 404 Not Found\r\n";
LAB_0012a7b2:
    lVar3 = 0x18;
    break;
  case method_not_allowed:
    pcVar4 = "HTTP/1.1 405 Method Not Allowed\r\n";
LAB_0012a80a:
    lVar3 = 0x21;
    break;
  case conflict:
    pcVar4 = "HTTP/1.1 409 Conflict\r\n";
LAB_0012a7c0:
    lVar3 = 0x17;
    break;
  case range_not_satisfiable:
    pcVar4 = "HTTP/1.1 416 Requested Range Not Satisfiable\r\n";
    lVar3 = 0x2e;
    break;
  default:
    switch(sVar1) {
    case internal_server_error:
      pcVar4 = "HTTP/1.1 500 Internal Server Error\r\n";
      lVar3 = 0x24;
      break;
    default:
      goto switchD_0012a6bd_caseD_12f;
    case bad_gateway:
      pcVar4 = "HTTP/1.1 502 Bad Gateway\r\n";
      goto LAB_0012a818;
    case service_unavailable:
      pcVar4 = "HTTP/1.1 503 Service Unavailable\r\n";
    }
  }
LAB_0012a826:
  __n = lVar3 - 9U;
  if (lVar3 - 0xbU <= lVar3 - 9U) {
    __n = lVar3 - 0xbU;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->content_,pcVar4 + 9,__n);
LAB_0012a83e:
  if (this->fmt_type_ == chunked) {
    pcVar4 = "Transfer-Encoding: chunked\r\n";
    sVar2 = 0x1c;
  }
  else {
    __value = (this->content_)._M_string_length;
    if ((this->content_view_)._M_len != 0 || __value != 0) {
      if (__value == 0) {
        __value = (this->content_view_)._M_len;
      }
      pcVar4 = this->buf_;
      _Var6 = std::__to_chars_i<unsigned_long>(pcVar4,&this->field_0x4b,__value,10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (resp_str,"Content-Length: ",0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (resp_str,pcVar4,(long)_Var6.ptr - (long)pcVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (resp_str,CRCF_abi_cxx11_,DAT_0016a970);
      goto LAB_0012a88c;
    }
    if ((uStack_38._7_1_ != '\0') || ((this->boundary_)._M_string_length != 0)) goto LAB_0012a88c;
    pcVar4 = "Content-Length: 0\r\n";
    sVar2 = 0x13;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (resp_str,pcVar4,sVar2);
LAB_0012a88c:
  if (this->need_date_ == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,"Date: ",6);
    lVar3 = std::chrono::_V2::system_clock::now();
    buf = (char (*) [32])(lVar3 / 1000000000);
    this_00 = (cinatra *)(*in_FS_OFFSET + -0x30);
    if ((char (*) [32])in_FS_OFFSET[-2] == buf) {
      sVar2 = in_FS_OFFSET[-1];
    }
    else {
      sVar5._M_str = in_R8;
      sVar5._M_len = (size_t)"%a, %d %b %Y %H:%M:%S";
      sVar5 = get_local_time_str<0ul,32ul>(this_00,buf,0x15,sVar5);
      this_00 = (cinatra *)sVar5._M_str;
      *(undefined4 *)((long)in_FS_OFFSET + (sVar5._M_len - 0x30)) = 0x544d4720;
      sVar2 = sVar5._M_len + 4;
      in_FS_OFFSET[-1] = sVar2;
      in_FS_OFFSET[-2] = (long)buf;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,(char *)this_00,sVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (resp_str,CRCF_abi_cxx11_,DAT_0016a970);
  }
  if ((this->keepalive_).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true) {
    if ((this->keepalive_).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_payload._M_value == true) {
      pcVar4 = "Connection: keep-alive\r\n";
      sVar2 = 0x18;
    }
    else {
      pcVar4 = "Connection: close\r\n";
      sVar2 = 0x13;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,pcVar4,sVar2);
  }
  append_header_str<std::__cxx11::string,std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (this,resp_str,&this->resp_headers_);
  if ((this->resp_header_span_)._M_extent._M_extent_value != 0) {
    append_header_str<std::__cxx11::string,std::span<cinatra::http_header,18446744073709551615ul>>
              (this,resp_str,&this->resp_header_span_);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (resp_str,CRCF_abi_cxx11_,DAT_0016a970);
  sVar2 = (this->content_view_)._M_len;
  if (sVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (resp_str,(this->content_)._M_dataplus._M_p,(this->content_)._M_string_length);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,(this->content_view_)._M_str,sVar2);
  }
  return;
}

Assistant:

void build_resp_str(std::string &resp_str) {
    resp_str.append(to_http_status_string(status_));
    bool has_len = false;
    bool has_host = false;
    check_header(resp_headers_, has_len, has_host);
    if (!resp_header_span_.empty()) {
      check_header(resp_header_span_, has_len, has_host);
    }

    if (!has_host) {
      resp_str.append(CINATRA_HOST_SV);
    }

    if (content_.empty() && !has_set_content_ &&
        fmt_type_ != format_type::chunked) {
      content_.append(default_status_content(status_));
    }

    if (fmt_type_ == format_type::chunked) {
      resp_str.append(TRANSFER_ENCODING_SV);
    }
    else {
      if (!content_.empty() || !content_view_.empty()) {
        size_t content_size =
            content_.empty() ? content_view_.size() : content_.size();
        auto [ptr, ec] = std::to_chars(buf_, buf_ + 32, content_size);
        resp_str.append(CONTENT_LENGTH_SV);
        resp_str.append(std::string_view(buf_, std::distance(buf_, ptr)));
        resp_str.append(CRCF);
      }
      else {
        if (!has_len && boundary_.empty())
          resp_str.append(ZERO_LENGTH_SV);
      }
    }

    if (need_date_) {
      resp_str.append(DATE_SV);
      resp_str.append(get_gmt_time_str());
      resp_str.append(CRCF);
    }

    if (keepalive_.has_value()) {
      bool keepalive = keepalive_.value();
      keepalive ? resp_str.append(CONN_KEEP_SV)
                : resp_str.append(CONN_CLOSE_SV);
    }

    append_header_str(resp_str, resp_headers_);

    if (!resp_header_span_.empty()) {
      append_header_str(resp_str, resp_header_span_);
    }

    resp_str.append(CRCF);
    if (content_view_.empty()) {
      resp_str.append(content_);
    }
    else {
      resp_str.append(content_view_);
    }
  }